

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumenter.cpp
# Opt level: O3

void __thiscall wasm::Instrumenter::addProfileExport(Instrumenter *this,size_t numFuncs)

{
  undefined8 *puVar1;
  StorageKind SVar2;
  Module *pMVar3;
  pointer puVar4;
  _Head_base<0UL,_wasm::Memory_*,_false> _Var5;
  __uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_> _Var6;
  undefined8 uVar7;
  uintptr_t uVar8;
  _Head_base<0UL,_wasm::Function_*,_false> _Var9;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *ex;
  ulong uVar10;
  char *pcVar11;
  Type type;
  Const *pCVar12;
  __uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> _Var13;
  undefined4 *puVar14;
  undefined4 *puVar15;
  Expression *pEVar16;
  undefined4 *puVar17;
  Expression *pEVar18;
  Expression *value;
  Store *pSVar19;
  LocalSet *args;
  Break *args_1;
  Block *pBVar20;
  pointer puVar21;
  undefined1 (*pauVar22) [16];
  int x;
  Address AVar23;
  long lVar24;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range2;
  Signature SVar25;
  Name NVar26;
  Name root;
  undefined1 auVar27 [16];
  Name NVar28;
  string_view sVar29;
  Expression EVar30;
  Expression EVar31;
  string_view sVar32;
  Name name;
  Name name_00;
  HeapType local_f8;
  Type local_f0;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  Name loadMemoryName;
  __single_object export__1;
  undefined1 auStack_78 [8];
  __single_object memory;
  Store *local_58;
  _Head_base<0UL,_wasm::Function_*,_false> local_50;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> writeProfile;
  Builder local_40;
  Builder builder;
  
  pMVar3 = this->wasm;
  auVar27 = wasm::IString::interned
                      ((this->config->profileExport)._M_string_length,
                       (this->config->profileExport)._M_dataplus._M_p,0);
  memory._M_t.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true>)
       (__uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>)0x0;
  NVar28.super_IString.str._M_str = (char *)auStack_78;
  NVar28.super_IString.str._M_len = auVar27._8_8_;
  auStack_78 = (undefined1  [8])pMVar3;
  NVar28 = Names::getValidName(auVar27._0_8_,NVar28,(function<bool_(wasm::Name)> *)auStack_78);
  std::
  _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/names.h:72:11)>
  ::_M_manager((_Any_data *)auStack_78,(_Any_data *)auStack_78,__destroy_functor);
  local_40.wasm = (Module *)0x2;
  builder.wasm = (Module *)0x2;
  wasm::Type::Type(&local_f0,&local_40,2);
  SVar25.results.id = 2;
  SVar25.params.id = local_f0.id;
  wasm::HeapType::HeapType(&local_f8,SVar25);
  auStack_78 = (undefined1  [8])0x0;
  memory._M_t.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true>)
       (__uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>)0x0;
  name.super_IString.str._M_str = NVar28.super_IString.str._M_len;
  name.super_IString.str._M_len = (size_t)&local_50;
  Builder::makeFunction
            (name,(HeapType)NVar28.super_IString.str._M_str,
             (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_f8.id,(Expression *)auStack_78
            );
  if (auStack_78 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_78,-(long)auStack_78);
  }
  _Var9._M_head_impl = local_50._M_head_impl;
  ((local_50._M_head_impl)->super_Importable).super_Named.hasExplicitName = true;
  uVar10 = wasm::IString::interned(4,"addr",0);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar10;
  wasm::Function::setLocalName((uint)_Var9._M_head_impl,(Name)(auVar27 << 0x40));
  _Var9._M_head_impl = local_50._M_head_impl;
  pcVar11 = (char *)wasm::IString::interned(4,"size",0);
  NVar26.super_IString.str._M_str = pcVar11;
  NVar26.super_IString.str._M_len = 1;
  wasm::Function::setLocalName((uint)_Var9._M_head_impl,NVar26);
  pMVar3 = this->wasm;
  AVar23.addr = numFuncs * 4 + 0x10007 >> 0x10;
  puVar4 = (pMVar3->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_40.wasm = pMVar3;
  if (puVar4 == (pMVar3->memories).
                super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    auVar27 = wasm::IString::interned(1,"0",0);
    auStack_78 = (undefined1  [8])operator_new(0x58);
    *(undefined8 *)*(undefined1 (*) [16])((long)auStack_78 + 0x40) = 0;
    *(undefined8 *)(*(undefined1 (*) [16])((long)auStack_78 + 0x40) + 8) = 0;
    *(undefined8 *)*(undefined1 (*) [16])((long)auStack_78 + 0x30) = 0;
    *(undefined8 *)(*(undefined1 (*) [16])((long)auStack_78 + 0x30) + 8) = 0;
    *(undefined8 *)*(undefined1 (*) [16])((long)auStack_78 + 0x20) = 0;
    *(undefined8 *)(*(undefined1 (*) [16])((long)auStack_78 + 0x20) + 8) = 0;
    *(undefined8 *)*(undefined1 (*) [16])((long)auStack_78 + 0x10) = 0;
    *(undefined8 *)(*(undefined1 (*) [16])((long)auStack_78 + 0x10) + 8) = 0;
    *(undefined1 (*) [16])auStack_78 = auVar27;
    *(undefined8 *)*(undefined1 (*) [16])((long)auStack_78 + 0x40) = 0x10000;
    *(undefined8 *)*(undefined1 (*) [16])((long)auStack_78 + 0x50) = 2;
    wasm::Module::addMemory((unique_ptr *)pMVar3);
    if (auStack_78 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_78,0x58);
    }
    _Var13._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         (((this->wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t;
    *(address64_t *)
     ((long)_Var13._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
            super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x38) = AVar23.addr;
    *(address64_t *)
     ((long)_Var13._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
            super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x40) = AVar23.addr;
  }
  else {
    _Var5._M_head_impl =
         (puVar4->_M_t).super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t
         .super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
         super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    if ((((_Var5._M_head_impl)->initial).addr < AVar23.addr) &&
       (((_Var5._M_head_impl)->initial).addr = AVar23.addr,
       ((_Var5._M_head_impl)->max).addr < AVar23.addr)) {
      ((_Var5._M_head_impl)->max).addr = AVar23.addr;
    }
  }
  type.id = (uintptr_t)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
  ((Expression *)type.id)->_id = LocalGetId;
  ((Expression *)(type.id + 0x10))->_id = InvalidId;
  (((Expression *)type.id)->type).id = 2;
  pCVar12 = Builder::makeConst<long>(&local_40,this->moduleHash);
  local_58 = Builder::makeStore(&local_40,8,(Address)0x0,1,(Expression *)type.id,
                                (Expression *)pCVar12,(Type)0x3,
                                (Name)*(string_view *)
                                       (((this->wasm->memories).
                                         super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                       super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                                       ._M_t);
  _Var9._M_head_impl = local_50._M_head_impl;
  SVar2 = this->config->storageKind;
  if (SVar2 - InMemory < 2) {
    auVar27 = wasm::IString::interned(7,"funcIdx",0);
    name_00.super_IString.str._M_len = auVar27._8_8_;
    name_00.super_IString.str._M_str = (char *)0x2;
    writeProfile._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
    _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._0_4_ =
         Builder::addVar((Builder *)_Var9._M_head_impl,auVar27._0_8_,name_00,type);
    if (this->config->storageKind == InMemory) {
      _Var13._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
           (((this->wasm->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t;
    }
    else {
      _Var13._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
           (tuple<wasm::Memory_*,_std::default_delete<wasm::Memory>_>)&this->secondaryMemory;
    }
    uStack_e8 = *(undefined4 *)
                 _Var13._M_t.
                 super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                 super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    uStack_e4 = *(undefined4 *)
                 ((long)_Var13._M_t.
                        super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                        super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 4);
    loadMemoryName.super_IString.str._M_len._0_4_ =
         *(undefined4 *)
          ((long)_Var13._M_t.
                 super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                 super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
    loadMemoryName.super_IString.str._M_len._4_4_ =
         *(undefined4 *)
          ((long)_Var13._M_t.
                 super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                 super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0xc);
    sVar29 = (string_view)wasm::IString::interned(5,"outer",0);
    EVar30 = (Expression)wasm::IString::interned(1,"l",0);
    EVar31 = (Expression)wasm::IString::interned(5,"outer",0);
    puVar14 = (undefined4 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
    *puVar14 = 8;
    puVar14[4] = (Index)writeProfile._M_t.
                        super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                        .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    *(undefined8 *)(puVar14 + 2) = 2;
    pCVar12 = Builder::makeConst<unsigned_int>(&local_40,(uint)numFuncs);
    puVar15 = (undefined4 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
    *puVar15 = 0x10;
    *(undefined8 *)(puVar15 + 2) = 0;
    puVar15[4] = 0xf;
    *(undefined4 **)(puVar15 + 6) = puVar14;
    *(Const **)(puVar15 + 8) = pCVar12;
    wasm::Binary::finalize();
    pEVar16 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x30,8);
    pEVar16->_id = BreakId;
    (pEVar16->type).id = 1;
    pEVar16[1] = EVar31;
    *(undefined8 *)(pEVar16 + 2) = 0;
    pEVar16[2].type.id = (uintptr_t)puVar15;
    wasm::Break::finalize();
    puVar14 = (undefined4 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
    *puVar14 = 8;
    puVar14[4] = 0;
    *(undefined8 *)(puVar14 + 2) = 2;
    puVar15 = (undefined4 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
    *puVar15 = 8;
    puVar15[4] = (Index)writeProfile._M_t.
                        super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                        .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    *(undefined8 *)(puVar15 + 2) = 2;
    pCVar12 = Builder::makeConst<unsigned_int>(&local_40,4);
    puVar17 = (undefined4 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
    *puVar17 = 0x10;
    *(undefined8 *)(puVar17 + 2) = 0;
    puVar17[4] = 2;
    *(undefined4 **)(puVar17 + 6) = puVar15;
    *(Const **)(puVar17 + 8) = pCVar12;
    wasm::Binary::finalize();
    pEVar18 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
    pEVar18->_id = BinaryId;
    (pEVar18->type).id = 0;
    pEVar18[1]._id = InvalidId;
    pEVar18[1].type.id = (uintptr_t)puVar14;
    *(undefined4 **)(pEVar18 + 2) = puVar17;
    wasm::Binary::finalize();
    puVar14 = (undefined4 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
    *puVar14 = 8;
    puVar14[4] = (Index)writeProfile._M_t.
                        super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                        .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    *(undefined8 *)(puVar14 + 2) = 2;
    value = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x48,8);
    value->_id = LoadId;
    *(undefined1 *)&value[1]._id = BlockId;
    *(byte *)((long)&value[1]._id + 1) = 0;
    value[1].type.id = 0;
    *(undefined8 *)(value + 2) = 1;
    *(undefined4 **)(value + 3) = puVar14;
    (value->type).id = 2;
    value[3].type.id = CONCAT44(uStack_e4,uStack_e8);
    *(ulong *)(value + 4) =
         CONCAT44(loadMemoryName.super_IString.str._M_len._4_4_,
                  (undefined4)loadMemoryName.super_IString.str._M_len);
    *(undefined1 *)&value[2].type.id = 1;
    pSVar19 = Builder::makeStore(&local_40,4,(Address)0x8,4,pEVar18,value,(Type)0x2,
                                 (Name)*(string_view *)
                                        (((this->wasm->memories).
                                          super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                        super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                                        ._M_t);
    puVar14 = (undefined4 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
    *puVar14 = 8;
    puVar14[4] = (Index)writeProfile._M_t.
                        super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                        .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    *(undefined8 *)(puVar14 + 2) = 2;
    pCVar12 = Builder::makeConst<unsigned_int>(&local_40,1);
    pEVar18 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
    pEVar18->_id = BinaryId;
    (pEVar18->type).id = 0;
    pEVar18[1]._id = InvalidId;
    pEVar18[1].type.id = (uintptr_t)puVar14;
    *(Const **)(pEVar18 + 2) = pCVar12;
    wasm::Binary::finalize();
    args = Builder::makeLocalSet
                     (&local_40,
                      (Index)writeProfile._M_t.
                             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                             .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,pEVar18);
    sVar32 = (string_view)wasm::IString::interned(1,"l",0);
    args_1 = (Break *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x30,8);
    (args_1->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression._id = BreakId;
    (args_1->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 1;
    (args_1->name).super_IString.str = sVar32;
    args_1->value = (Expression *)0x0;
    args_1->condition = (Expression *)0x0;
    wasm::Break::finalize();
    pBVar20 = Builder::blockify<wasm::LocalSet*,wasm::Break*>
                        (&local_40,pEVar16,(Expression *)pSVar19,args,args_1);
    pEVar16 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
    pEVar16->_id = LoopId;
    (pEVar16->type).id = 0;
    pEVar16[1] = EVar30;
    *(Block **)(pEVar16 + 2) = pBVar20;
    wasm::Loop::finalize();
    pBVar20 = Builder::makeBlock(&local_40,pEVar16);
    (pBVar20->name).super_IString.str = sVar29;
    wasm::Block::finalize();
    local_58 = (Store *)Builder::blockify(&local_40,(Expression *)local_58,(Expression *)pBVar20);
  }
  else if (SVar2 == InGlobals) {
    writeProfile._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
    _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
         (this->functionGlobals).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl
         .super__Vector_impl_data._M_start;
    _Var6._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
         (tuple<wasm::Function_*,_std::default_delete<wasm::Function>_>)
         (this->functionGlobals).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if ((tuple<wasm::Function_*,_std::default_delete<wasm::Function>_>)
        writeProfile._M_t.
        super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
        super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl !=
        (_Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>)
        _Var6._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
        super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl) {
      lVar24 = 0;
      do {
        pEVar16 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
        puVar1 = (undefined8 *)
                 ((long)writeProfile._M_t.
                        super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                        .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + lVar24 * 4);
        pEVar16->_id = LocalGetId;
        pEVar16[1]._id = InvalidId;
        (pEVar16->type).id = 2;
        uVar7 = *puVar1;
        uVar8 = puVar1[1];
        pEVar18 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x20,8);
        AVar23.addr._0_4_ = (int)lVar24 + 8;
        AVar23.addr._4_4_ = 0;
        pEVar18->_id = GlobalGetId;
        *(undefined8 *)(pEVar18 + 1) = uVar7;
        pEVar18[1].type.id = uVar8;
        (pEVar18->type).id = 2;
        pSVar19 = Builder::makeStore(&local_40,4,AVar23,1,pEVar16,pEVar18,(Type)0x2,
                                     (Name)*(string_view *)
                                            (((this->wasm->memories).
                                              super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                            super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                                            ._M_t);
        local_58 = (Store *)Builder::blockify(&local_40,(Expression *)local_58,(Expression *)pSVar19
                                             );
        lVar24 = lVar24 + 4;
      } while ((tuple<wasm::Function_*,_std::default_delete<wasm::Function>_>)(puVar1 + 2) !=
               (_Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>)
               _Var6._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
    }
  }
  puVar14 = (undefined4 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
  *puVar14 = 8;
  puVar14[4] = 1;
  *(undefined8 *)(puVar14 + 2) = 2;
  x = (int)(numFuncs << 2) + 8;
  pCVar12 = Builder::makeConst<int>(&local_40,x);
  puVar15 = (undefined4 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
  *puVar15 = 0x10;
  *(undefined8 *)(puVar15 + 2) = 0;
  puVar15[4] = 0x18;
  *(undefined4 **)(puVar15 + 6) = puVar14;
  *(Const **)(puVar15 + 8) = pCVar12;
  wasm::Binary::finalize();
  pEVar16 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
  pEVar16->_id = IfId;
  (pEVar16->type).id = 0;
  *(undefined4 **)(pEVar16 + 1) = puVar15;
  pEVar16[1].type.id = (uintptr_t)local_58;
  *(undefined8 *)(pEVar16 + 2) = 0;
  wasm::If::finalize();
  pCVar12 = Builder::makeConst<int>(&local_40,x);
  pBVar20 = Builder::makeBlock(&local_40,pEVar16);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (&(pBVar20->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
             (Expression *)pCVar12);
  wasm::Block::finalize();
  (local_50._M_head_impl)->body = (Expression *)pBVar20;
  wasm::Module::addFunction((unique_ptr *)this->wasm);
  pMVar3 = this->wasm;
  auVar27 = wasm::IString::interned
                      ((this->config->profileExport)._M_string_length,
                       (this->config->profileExport)._M_dataplus._M_p,0);
  auStack_78 = (undefined1  [8])operator_new(0x28);
  (((Module *)auStack_78)->functions).
  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (((Module *)auStack_78)->exports).
  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar27._0_8_;
  (((Module *)auStack_78)->exports).
  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)auVar27._8_8_;
  *(IString *)
   &(((Module *)auStack_78)->exports).
    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = NVar28.super_IString.str;
  wasm::Module::addExport((unique_ptr *)pMVar3);
  if (auStack_78 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_78,0x28);
  }
  pMVar3 = this->wasm;
  if (*(long *)((long)(((pMVar3->memories).
                        super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                      super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> + 0x20
               ) == 0) {
    for (puVar21 = (pMVar3->exports).
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        puVar21 !=
        (pMVar3->exports).
        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; puVar21 = puVar21 + 1) {
      if (((puVar21->_M_t).super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>.
           _M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
           super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl)->kind == Memory)
      goto LAB_0011d1dd;
    }
    auVar27 = wasm::IString::interned(0xe,"profile-memory",0);
    auStack_78 = (undefined1  [8])this->wasm;
    _Var13._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         (((((Module *)auStack_78)->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t;
    memory._M_t.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true>)
         (__uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>)0x0;
    root.super_IString.str._M_str = auStack_78;
    root.super_IString.str._M_len =
         *(size_t *)
          ((long)_Var13._M_t.
                 super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                 super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
    NVar28 = Names::getValidName(*(Names **)
                                  _Var13._M_t.
                                  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                                  .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl,root,
                                 (function<bool_(wasm::Name)> *)
                                 _Var13._M_t.
                                 super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                                 .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl);
    std::
    _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/names.h:64:23)>
    ::_M_manager((_Any_data *)auStack_78,(_Any_data *)auStack_78,__destroy_functor);
    pauVar22 = (undefined1 (*) [16])operator_new(0x28);
    *(undefined8 *)pauVar22[2] = 2;
    *pauVar22 = auVar27;
    *(IString *)pauVar22[1] = NVar28.super_IString.str;
    wasm::Module::addExport((unique_ptr *)pMVar3);
    if (pauVar22 != (undefined1 (*) [16])0x0) {
      operator_delete(pauVar22,0x28);
    }
  }
LAB_0011d1dd:
  std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
            ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)&local_50);
  return;
}

Assistant:

void Instrumenter::addProfileExport(size_t numFuncs) {
  // Create and export a function to dump the profile into a given memory
  // buffer. The function takes the available address and buffer size as
  // arguments and returns the total size of the profile. It only actually
  // writes the profile if the given space is sufficient to hold it.
  auto name = Names::getValidFunctionName(*wasm, config.profileExport);
  auto writeProfile = Builder::makeFunction(
    name, Signature({Type::i32, Type::i32}, Type::i32), {});
  writeProfile->hasExplicitName = true;
  writeProfile->setLocalName(0, "addr");
  writeProfile->setLocalName(1, "size");

  // Calculate the size of the profile:
  //   8 bytes module hash +
  //   4 bytes for the timestamp for each function
  const size_t profileSize = 8 + 4 * numFuncs;

  // Create the function body
  Builder builder(*wasm);
  auto getAddr = [&]() { return builder.makeLocalGet(0, Type::i32); };
  auto getSize = [&]() { return builder.makeLocalGet(1, Type::i32); };
  auto hashConst = [&]() { return builder.makeConst(int64_t(moduleHash)); };
  auto profileSizeConst = [&]() {
    return builder.makeConst(int32_t(profileSize));
  };

  // Also make sure there is a memory with enough pages to write into
  size_t pages = (profileSize + Memory::kPageSize - 1) / Memory::kPageSize;
  if (wasm->memories.empty()) {
    wasm->addMemory(Builder::makeMemory("0"));
    wasm->memories[0]->initial = pages;
    wasm->memories[0]->max = pages;
  } else if (wasm->memories[0]->initial < pages) {
    wasm->memories[0]->initial = pages;
    if (wasm->memories[0]->max < pages) {
      wasm->memories[0]->max = pages;
    }
  }

  // Write the hash followed by all the time stamps
  Expression* writeData = builder.makeStore(
    8, 0, 1, getAddr(), hashConst(), Type::i64, wasm->memories[0]->name);
  uint32_t offset = 8;

  switch (config.storageKind) {
    case WasmSplitOptions::StorageKind::InGlobals: {
      for (const auto& global : functionGlobals) {
        writeData = builder.blockify(
          writeData,
          builder.makeStore(4,
                            offset,
                            1,
                            getAddr(),
                            builder.makeGlobalGet(global, Type::i32),
                            Type::i32,
                            wasm->memories[0]->name));
        offset += 4;
      }
      break;
    }
    case WasmSplitOptions::StorageKind::InMemory:
    case WasmSplitOptions::StorageKind::InSecondaryMemory: {
      Index funcIdxVar =
        Builder::addVar(writeProfile.get(), "funcIdx", Type::i32);
      auto getFuncIdx = [&]() {
        return builder.makeLocalGet(funcIdxVar, Type::i32);
      };
      Name loadMemoryName =
        config.storageKind == WasmSplitOptions::StorageKind::InMemory
          ? wasm->memories[0]->name
          : secondaryMemory;
      // (block $outer
      //   (loop $l
      //     (br_if $outer (i32.eq (local.get $fucIdx) (i32.const numFuncs))
      //     (i32.store offset=8
      //       (i32.add
      //         (local.get $addr)
      //         (i32.mul (local.get $funcIdx) (i32.const 4))
      //       )
      //       (i32.atomic.load8_u (local.get $funcIdx))
      //     )
      //     (local.set $funcIdx
      //      (i32.add (local.get $fundIdx) (i32.const 1)
      //     )
      //     (br $l)
      //   )
      // )
      writeData = builder.blockify(
        writeData,
        builder.makeBlock(
          "outer",
          builder.makeLoop(
            "l",
            builder.blockify(
              builder.makeBreak(
                "outer",
                nullptr,
                builder.makeBinary(EqInt32,
                                   getFuncIdx(),
                                   builder.makeConst(uint32_t(numFuncs)))),
              builder.makeStore(
                4,
                offset,
                4,
                builder.makeBinary(
                  AddInt32,
                  getAddr(),
                  builder.makeBinary(
                    MulInt32, getFuncIdx(), builder.makeConst(uint32_t(4)))),
                builder.makeAtomicLoad(
                  1, 0, getFuncIdx(), Type::i32, loadMemoryName),
                Type::i32,
                wasm->memories[0]->name),
              builder.makeLocalSet(
                funcIdxVar,
                builder.makeBinary(
                  AddInt32, getFuncIdx(), builder.makeConst(uint32_t(1)))),
              builder.makeBreak("l")))));
      break;
    }
  }

  writeProfile->body = builder.makeSequence(
    builder.makeIf(builder.makeBinary(GeUInt32, getSize(), profileSizeConst()),
                   writeData),
    profileSizeConst());

  // Create an export for the function
  wasm->addFunction(std::move(writeProfile));
  wasm->addExport(
    Builder::makeExport(config.profileExport, name, ExternalKind::Function));

  // Export the memory if it is not already exported or imported.
  if (!wasm->memories[0]->imported()) {
    bool memoryExported = false;
    for (auto& ex : wasm->exports) {
      if (ex->kind == ExternalKind::Memory) {
        memoryExported = true;
        break;
      }
    }
    if (!memoryExported) {
      wasm->addExport(Builder::makeExport(
        "profile-memory",
        Names::getValidExportName(*wasm, wasm->memories[0]->name),
        ExternalKind::Memory));
    }
  }
}